

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::ConversionExpression::convert
          (ConstantValue *__return_storage_ptr__,ConversionExpression *this,EvalContext *context,
          Type *from,Type *to,SourceRange sourceRange,ConstantValue *value,
          ConversionKind conversionKind)

{
  allocator<slang::ConstantValue> *this_00;
  SourceRange range;
  bool bVar1;
  bool isFourState;
  bitwidth_t bVar2;
  SVInt *this_01;
  size_t sVar3;
  Diagnostic *pDVar4;
  Queue *this_02;
  iterator pCVar5;
  iterator pCVar6;
  QueueType *pQVar7;
  Type *pTVar8;
  FixedSizeUnpackedArrayType *pFVar9;
  logic_error *plVar10;
  SourceRange sourceRange_00;
  undefined4 in_stack_fffffffffffffc4c;
  undefined1 in_stack_fffffffffffffc50;
  string local_300;
  allocator<char> local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  bitwidth_t local_238;
  byte local_231;
  bitwidth_t size_1;
  bool isSigned;
  Type *ct;
  undefined1 local_220 [8];
  SVQueue result;
  span<slang::ConstantValue,_18446744073709551615UL> elems;
  iterator local_1b0;
  iterator local_190;
  Elements local_170;
  SVQueue *local_158;
  SVQueue *q;
  SourceLocation local_148;
  undefined4 local_13c;
  ConstantRange local_138;
  size_t local_130;
  size_t size;
  string local_120;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  EvalContext *local_48;
  SourceLocation local_40;
  Type *local_38;
  Type *to_local;
  Type *from_local;
  EvalContext *context_local;
  SourceRange sourceRange_local;
  
  local_38 = from;
  to_local = (Type *)context;
  from_local = (Type *)this;
  context_local = (EvalContext *)to;
  sourceRange_local.startLoc = (SourceLocation)value;
  sourceRange_local.endLoc = (SourceLocation)__return_storage_ptr__;
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)sourceRange.startLoc);
  if (bVar1) {
    bVar1 = Type::isMatching(to_local,local_38);
    if (bVar1) {
      slang::ConstantValue::ConstantValue
                (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc);
    }
    else if ((sourceRange.endLoc._0_4_ == 4) || (sourceRange.endLoc._0_4_ == 2)) {
      local_48 = context_local;
      local_40 = sourceRange_local.startLoc;
      sourceRange_00.endLoc = (SourceLocation)from_local;
      sourceRange_00.startLoc = sourceRange_local.startLoc;
      Bitstream::evaluateCast
                (__return_storage_ptr__,(Bitstream *)local_38,(Type *)sourceRange.startLoc,
                 (ConstantValue *)context_local,sourceRange_00,
                 (EvalContext *)
                 CONCAT44(in_stack_fffffffffffffc4c,(uint)(sourceRange.endLoc._0_4_ == 2)),
                 (bool)in_stack_fffffffffffffc50);
    }
    else {
      bVar1 = Type::isIntegral(local_38);
      if (bVar1) {
        if ((sourceRange.endLoc._0_4_ == 1) &&
           (bVar1 = slang::ConstantValue::isInteger((ConstantValue *)sourceRange.startLoc), bVar1))
        {
          this_01 = slang::ConstantValue::integer((ConstantValue *)sourceRange.startLoc);
          bVar1 = Type::isSigned(local_38);
          SVInt::setSigned(this_01,bVar1);
        }
        bVar2 = Type::getBitWidth(local_38);
        bVar1 = Type::isSigned(local_38);
        isFourState = Type::isFourState(local_38);
        slang::ConstantValue::convertToInt
                  (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc,bVar2,bVar1,
                   isFourState);
      }
      else {
        bVar1 = Type::isFloating(local_38);
        if (bVar1) {
          bVar2 = Type::getBitWidth(local_38);
          if (bVar2 == 0x20) {
            slang::ConstantValue::convertToShortReal
                      (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc);
          }
          else {
            if (bVar2 != 0x40) {
              size._7_1_ = 1;
              plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                         ,&local_e9);
              std::operator+(&local_c8,&local_e8,":");
              std::__cxx11::to_string(&local_120,0x305);
              std::operator+(&local_a8,&local_c8,&local_120);
              std::operator+(&local_88,&local_a8,": ");
              std::operator+(&local_68,&local_88,"Default case should be unreachable!");
              std::logic_error::logic_error(plVar10,(string *)&local_68);
              size._7_1_ = 0;
              __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            slang::ConstantValue::convertToReal
                      (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc);
          }
        }
        else {
          bVar1 = Type::isString(local_38);
          if (bVar1) {
            slang::ConstantValue::convertToStr
                      (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc);
          }
          else {
            bVar1 = Type::isUnpackedArray(local_38);
            if ((bVar1) && (bVar1 = Type::isUnpackedArray(to_local), bVar1)) {
              bVar1 = Type::hasFixedRange(local_38);
              if ((bVar1) && (bVar1 = Type::hasFixedRange(to_local), bVar1)) {
                assert::assertFailed
                          ("!to.hasFixedRange() || !from.hasFixedRange()",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                           ,0x30f,
                           "static ConstantValue slang::ast::ConversionExpression::convert(EvalContext &, const Type &, const Type &, SourceRange, ConstantValue &&, ConversionKind)"
                          );
              }
              bVar1 = Type::hasFixedRange(local_38);
              if (bVar1) {
                sVar3 = slang::ConstantValue::size((ConstantValue *)sourceRange.startLoc);
                local_130 = sVar3;
                local_138 = Type::getFixedRange(local_38);
                bVar2 = ConstantRange::width(&local_138);
                if (sVar3 != bVar2) {
                  local_13c = 0x9000c;
                  q = (SVQueue *)context_local;
                  local_148 = sourceRange_local.startLoc;
                  range.endLoc = sourceRange_local.startLoc;
                  range.startLoc = (SourceLocation)context_local;
                  pDVar4 = EvalContext::addDiag((EvalContext *)from_local,(DiagCode)0x9000c,range);
                  pDVar4 = ast::operator<<(pDVar4,to_local);
                  pDVar4 = Diagnostic::operator<<(pDVar4,local_130);
                  ast::operator<<(pDVar4,local_38);
                  slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
                  return __return_storage_ptr__;
                }
              }
              bVar1 = Type::isQueue(local_38);
              if ((bVar1) || (bVar1 = Type::isQueue(to_local), !bVar1)) {
                bVar1 = Type::isQueue(local_38);
                if ((!bVar1) || (bVar1 = Type::isQueue(to_local), bVar1)) {
                  slang::ConstantValue::ConstantValue
                            (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc);
                }
                else {
                  join_0x00000010_0x00000000_ =
                       slang::ConstantValue::elements((ConstantValue *)sourceRange.startLoc);
                  pCVar5 = nonstd::span_lite::span<slang::ConstantValue,_18446744073709551615UL>::
                           begin((span<slang::ConstantValue,_18446744073709551615UL> *)
                                 &result.maxBound);
                  pCVar6 = nonstd::span_lite::span<slang::ConstantValue,_18446744073709551615UL>::
                           end((span<slang::ConstantValue,_18446744073709551615UL> *)
                               &result.maxBound);
                  std::allocator<slang::ConstantValue>::allocator
                            ((allocator<slang::ConstantValue> *)((long)&ct + 7));
                  SVQueue::deque<slang::ConstantValue*,void>
                            ((SVQueue *)local_220,pCVar5,pCVar6,
                             (allocator<slang::ConstantValue> *)((long)&ct + 7));
                  std::allocator<slang::ConstantValue>::~allocator
                            ((allocator<slang::ConstantValue> *)((long)&ct + 7));
                  pTVar8 = Type::getCanonicalType(local_38);
                  pQVar7 = Symbol::as<slang::ast::QueueType>(&pTVar8->super_Symbol);
                  result.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                  super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node._0_4_ = pQVar7->maxBound;
                  SVQueue::resizeToBound((SVQueue *)local_220);
                  slang::ConstantValue::ConstantValue(__return_storage_ptr__,(SVQueue *)local_220);
                  SVQueue::~SVQueue((SVQueue *)local_220);
                }
              }
              else {
                this_02 = slang::ConstantValue::queue((ConstantValue *)sourceRange.startLoc);
                local_158 = CopyPtr<slang::SVQueue>::operator*(this_02);
                std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::begin
                          (&local_190,
                           &local_158->
                            super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                          );
                std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::end
                          (&local_1b0,
                           &local_158->
                            super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                          );
                this_00 = (allocator<slang::ConstantValue> *)((long)&elems.size_ + 7);
                std::allocator<slang::ConstantValue>::allocator(this_00);
                std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
                vector<std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>,void>
                          ((vector<slang::ConstantValue,std::allocator<slang::ConstantValue>> *)
                           &local_170,&local_190,&local_1b0,this_00);
                slang::ConstantValue::ConstantValue(__return_storage_ptr__,&local_170);
                std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                          (&local_170);
                std::allocator<slang::ConstantValue>::~allocator
                          ((allocator<slang::ConstantValue> *)((long)&elems.size_ + 7));
              }
            }
            else {
              bVar1 = Type::isByteArray(local_38);
              if (bVar1) {
                _size_1 = Type::getCanonicalType(local_38);
                pTVar8 = Type::getArrayElementType(_size_1);
                local_231 = Type::isSigned(pTVar8);
                bVar1 = Type::isQueue(_size_1);
                if (bVar1) {
                  slang::ConstantValue::convertToByteQueue
                            (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc,
                             (bool)(local_231 & 1));
                }
                else {
                  bVar1 = Type::hasFixedRange(_size_1);
                  if (bVar1) {
                    pFVar9 = Symbol::as<slang::ast::FixedSizeUnpackedArrayType>
                                       (&_size_1->super_Symbol);
                    local_238 = ConstantRange::width(&pFVar9->range);
                  }
                  else {
                    local_238 = 0;
                  }
                  slang::ConstantValue::convertToByteArray
                            (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc,local_238,
                             (bool)(local_231 & 1));
                }
              }
              else {
                bVar1 = Type::isNull(to_local);
                if (!bVar1) {
                  plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2d8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                             ,&local_2d9);
                  std::operator+(&local_2b8,&local_2d8,":");
                  std::__cxx11::to_string(&local_300,0x33f);
                  std::operator+(&local_298,&local_2b8,&local_300);
                  std::operator+(&local_278,&local_298,": ");
                  std::operator+(&local_258,&local_278,"Default case should be unreachable!");
                  std::logic_error::logic_error(plVar10,(string *)&local_258);
                  __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                }
                slang::ConstantValue::ConstantValue
                          (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc);
              }
            }
          }
        }
      }
    }
  }
  else {
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue ConversionExpression::convert(EvalContext& context, const Type& from, const Type& to,
                                            SourceRange sourceRange, ConstantValue&& value,
                                            ConversionKind conversionKind) {
    if (!value)
        return nullptr;

    if (from.isMatching(to))
        return std::move(value);

    if (conversionKind == ConversionKind::BitstreamCast ||
        conversionKind == ConversionKind::StreamingConcat) {
        return Bitstream::evaluateCast(to, std::move(value), sourceRange, context,
                                       conversionKind == ConversionKind::StreamingConcat);
    }

    if (to.isIntegral()) {
        // [11.8.2] last bullet says: the operand shall be sign-extended only if the propagated type
        // is signed. It is different from [11.8.3] ConstantValue::convertToInt uses.
        // ConversionKind::Propagated marked in Expression::PropagationVisitor
        if (conversionKind == ConversionKind::Propagated && value.isInteger())
            value.integer().setSigned(to.isSigned());
        return value.convertToInt(to.getBitWidth(), to.isSigned(), to.isFourState());
    }

    if (to.isFloating()) {
        switch (to.getBitWidth()) {
            case 32:
                return value.convertToShortReal();
            case 64:
                return value.convertToReal();
            default:
                ASSUME_UNREACHABLE;
        }
    }

    if (to.isString())
        return value.convertToStr();

    if (to.isUnpackedArray() && from.isUnpackedArray()) {
        // Conversion to a dynamic array just resizes. Conversion to a fixed array
        // must have the same number of elements in the source.
        ASSERT(!to.hasFixedRange() || !from.hasFixedRange());
        if (to.hasFixedRange()) {
            size_t size = value.size();
            if (size != to.getFixedRange().width()) {
                context.addDiag(diag::ConstEvalDynamicToFixedSize, sourceRange)
                    << from << size << to;
                return nullptr;
            }
        }

        if (!to.isQueue() && from.isQueue()) {
            // Convert from queue to vector.
            auto& q = *value.queue();
            return std::vector(q.begin(), q.end());
        }

        if (to.isQueue() && !from.isQueue()) {
            // Convert from vector to queue.
            auto elems = value.elements();
            SVQueue result(elems.begin(), elems.end());
            result.maxBound = to.getCanonicalType().as<QueueType>().maxBound;
            result.resizeToBound();
            return result;
        }

        return std::move(value);
    }

    if (to.isByteArray()) {
        auto& ct = to.getCanonicalType();
        bool isSigned = ct.getArrayElementType()->isSigned();
        if (ct.isQueue())
            return value.convertToByteQueue(isSigned);

        bitwidth_t size;
        if (ct.hasFixedRange())
            size = ct.as<FixedSizeUnpackedArrayType>().range.width();
        else
            size = 0; // dynamic array use string size

        return value.convertToByteArray(size, isSigned);
    }

    // Null can be assigned to various destination types. It's ok to just
    // keep propagating the null value.
    if (from.isNull())
        return std::move(value);

    ASSUME_UNREACHABLE;
}